

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

_Bool ts_are_copies(TCGTemp *ts1,TCGTemp *ts2)

{
  TCGTemp *pTVar1;
  bool bVar2;
  
  if (ts1 == ts2) {
    return true;
  }
  if (((*(TCGTemp **)((long)ts1->state_ptr + 0x10) != ts1) &&
      (*(TCGTemp **)((long)ts2->state_ptr + 0x10) != ts2)) &&
     (pTVar1 = *(TCGTemp **)((long)ts1->state_ptr + 0x10), pTVar1 != ts1)) {
    do {
      bVar2 = pTVar1 == ts2;
      if (bVar2) {
        return bVar2;
      }
      pTVar1 = *(TCGTemp **)((long)pTVar1->state_ptr + 0x10);
    } while (pTVar1 != ts1);
    return bVar2;
  }
  return false;
}

Assistant:

static bool ts_are_copies(TCGTemp *ts1, TCGTemp *ts2)
{
    TCGTemp *i;

    if (ts1 == ts2) {
        return true;
    }

    if (!ts_is_copy(ts1) || !ts_is_copy(ts2)) {
        return false;
    }

    for (i = ts_info(ts1)->next_copy; i != ts1; i = ts_info(i)->next_copy) {
        if (i == ts2) {
            return true;
        }
    }

    return false;
}